

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall vera::Image::Image(Image *this,int _width,int _height,int _channels)

{
  undefined8 in_R8;
  undefined8 in_R9;
  vector<float,_std::allocator<float>_> *this_00;
  allocator local_1d;
  int local_1c;
  int local_18;
  int _channels_local;
  int _height_local;
  int _width_local;
  Image *this_local;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_0076ca98;
  local_1c = _channels;
  local_18 = _height;
  _channels_local = _width;
  __height_local = this;
  std::__cxx11::string::string((string *)&this->name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_path,"",&local_1d);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  this_00 = &this->m_data;
  std::vector<float,_std::allocator<float>_>::vector(this_00);
  (*this->_vptr_Image[4])
            (this,(long)_channels_local,(long)local_18,(long)local_1c,in_R8,in_R9,this_00);
  return;
}

Assistant:

Image::Image(int _width, int _height, int _channels): m_path("") {
    allocate(_width, _height, _channels);
}